

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void Cmd_useflechette(FCommandLine *argv,APlayerPawn *who,int key)

{
  APlayerPawn *this;
  AInventory *pAVar1;
  FName local_44;
  undefined8 local_40;
  AInventory *item_1;
  undefined8 uStack_30;
  int j;
  AInventory *item;
  PClassActor *type;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (who != (APlayerPawn *)0x0) {
    item = (AInventory *)who->FlechetteType;
    type._4_4_ = key;
    pAStack_18 = who;
    who_local = (APlayerPawn *)argv;
    if (item != (AInventory *)0x0) {
      pAVar1 = AActor::FindInventory(&who->super_AActor,(PClassActor *)item,false);
      if (pAVar1 != (AInventory *)0x0) {
        SendItemUse = pAVar1;
        return;
      }
      uStack_30 = 0;
    }
    for (item_1._4_4_ = 0; this = pAStack_18, item_1._4_4_ < 3; item_1._4_4_ = item_1._4_4_ + 1) {
      FName::FName(&local_44,Cmd_useflechette::bagnames[item_1._4_4_]);
      pAVar1 = AActor::FindInventory(&this->super_AActor,&local_44);
      if (pAVar1 != (AInventory *)0x0) {
        SendItemUse = pAVar1;
        return;
      }
      local_40 = 0;
    }
  }
  return;
}

Assistant:

CCMD (useflechette)
{ // Select from one of arti_poisonbag1-3, whichever the player has
	static const ENamedName bagnames[3] =
	{
		NAME_ArtiPoisonBag3,	// use type 3 first because that's the default when the player has none specified.
		NAME_ArtiPoisonBag1,
		NAME_ArtiPoisonBag2
	};

	if (who == NULL)
		return;

	PClassActor *type = who->FlechetteType;
	if (type != NULL)
	{
		AInventory *item;
		if ( (item = who->FindInventory (type) ))
		{
			SendItemUse = item;
			return;
		}
	}

	// The default flechette could not be found, or the player had no default. Try all 3 types then.
	for (int j = 0; j < 3; ++j)
	{
		AInventory *item;
		if ( (item = who->FindInventory (bagnames[j])) )
		{
			SendItemUse = item;
			break;
		}
	}
}